

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

double __thiscall ON_SubDEdge::EndSharpness(ON_SubDEdge *this,ON_SubDVertex *v)

{
  if (v == (ON_SubDVertex *)0x0) {
    return 0.0;
  }
  if (this->m_vertex[0] == v) {
    if ((this->m_edge_tag == SmoothX) || (this->m_edge_tag == Smooth)) {
      return (double)(this->m_sharpness).m_edge_sharpness[0];
    }
  }
  else {
    if (this->m_vertex[1] != v) {
      return 0.0;
    }
    if ((this->m_edge_tag == SmoothX) || (this->m_edge_tag == Smooth)) {
      return (double)(this->m_sharpness).m_edge_sharpness[1];
    }
  }
  return 0.0;
}

Assistant:

double ON_SubDEdge::EndSharpness(
  const ON_SubDVertex* v
) const
{
  if (nullptr != v)
  {
    if (v == m_vertex[0])
      return EndSharpness(0U);
    if (v == m_vertex[1])
      return EndSharpness(1U);
  }
  return 0.0;
}